

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cpp
# Opt level: O1

callback_t *
begin_class_state(callback_t *__return_storage_ptr__,MetaConfiguration *conf,ifstream *f,int *error)

{
  long *plVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  QTextStream *pQVar2;
  long lVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  QDebug *debug;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  shared_ptr<MetaClass> old_parent;
  QTextStream *local_60;
  QString local_58;
  undefined4 local_40;
  undefined4 uStack_3c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_38;
  undefined4 uStack_30;
  undefined4 local_2c;
  undefined8 local_28;
  
  parser();
  if ((parser()::category[0x10] & 1) != 0) {
    parser();
    local_40 = 2;
    uStack_3c = 0;
    _Stack_38._M_pi._0_4_ = 0;
    _Stack_38._M_pi._4_4_ = 0;
    uStack_30 = 0;
    local_2c = 0;
    local_28 = parser()::category._8_8_;
    QMessageLogger::debug();
    pQVar2 = local_60;
    QVar6.m_data = (storage_type *)0x10;
    QVar6.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar6);
    QTextStream::operator<<(pQVar2,&local_58);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.d.d !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,8);
      }
    }
    if (local_60[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(local_60,' ');
    }
    operator<<((QDebug *)&local_60,(string *)&(anonymous_namespace)::global_string_abi_cxx11_);
    QDebug::~QDebug((QDebug *)&local_60);
  }
  std::istream::ignore();
  clear_empty(f);
  anon_unknown.dwarf_22738::trim((string *)&(anonymous_namespace)::global_string_abi_cxx11_);
  if ((conf->top_level_class).super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    parser();
    if ((parser()::category[0x10] & 1) != 0) {
      parser();
      local_40 = 2;
      uStack_3c = 0;
      _Stack_38._M_pi._0_4_ = 0;
      _Stack_38._M_pi._4_4_ = 0;
      uStack_30 = 0;
      local_2c = 0;
      local_28 = parser()::category._8_8_;
      QMessageLogger::debug();
      pQVar2 = local_60;
      QVar8.m_data = (storage_type *)0x1c;
      QVar8.m_size = (qsizetype)&local_58;
      QString::fromUtf8(QVar8);
      QTextStream::operator<<(pQVar2,&local_58);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.d.d !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,8);
        }
      }
      if (local_60[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(local_60,' ');
      }
      QDebug::~QDebug((QDebug *)&local_60);
    }
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
    p_Var5->_M_use_count = 1;
    p_Var5->_M_weak_count = 1;
    p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00118c38;
    p_Var5[5]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var5[5]._M_use_count = 0;
    p_Var5[5]._M_weak_count = 0;
    p_Var5[6]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var5[6]._M_use_count = 0;
    p_Var5[6]._M_weak_count = 0;
    p_Var5[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var5[1]._M_use_count = 0;
    p_Var5[1]._M_weak_count = 0;
    p_Var5[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var5[2]._M_use_count = 0;
    p_Var5[2]._M_weak_count = 0;
    p_Var5[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var5[3]._M_use_count = 0;
    p_Var5[3]._M_weak_count = 0;
    p_Var5[4]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var5[4]._M_use_count = 0;
    p_Var5[4]._M_weak_count = 0;
    p_Var5[5]._vptr__Sp_counted_base = (_func_int **)(p_Var5 + 6);
    p_Var5[5]._M_use_count = 0;
    p_Var5[5]._M_weak_count = 0;
    *(undefined1 *)&p_Var5[6]._vptr__Sp_counted_base = 0;
    (conf->top_level_class).super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var5 + 1);
    this = (conf->top_level_class).super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    (conf->top_level_class).super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var5;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    (anonymous_namespace)::current_class =
         (conf->top_level_class).super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&DAT_00119300,
               &(conf->top_level_class).super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    if ((anonymous_namespace)::current_class == (element_type *)0x0) {
      __assert_fail("current_class",
                    "/workspace/llm4binary/github/license_c_cmakelists/tcanabrava[P]configuration-parser/parser/statemachine.cpp"
                    ,0x86,
                    "callback_t begin_class_state(MetaConfiguration &, std::ifstream &, int &)");
    }
    parser();
    if ((parser()::category[0x10] & 1) != 0) {
      parser();
      local_40 = 2;
      uStack_3c = 0;
      _Stack_38._M_pi._0_4_ = 0;
      _Stack_38._M_pi._4_4_ = 0;
      uStack_30 = 0;
      local_2c = 0;
      local_28 = parser()::category._8_8_;
      QMessageLogger::debug();
      pQVar2 = local_60;
      QVar7.m_data = (storage_type *)0x19;
      QVar7.m_size = (qsizetype)&local_58;
      QString::fromUtf8(QVar7);
      QTextStream::operator<<(pQVar2,&local_58);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.d.d !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,8);
        }
      }
      if (local_60[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(local_60,' ');
      }
      operator<<((QDebug *)&local_60,(string *)((long)(anonymous_namespace)::current_class + 0x40));
      QDebug::~QDebug((QDebug *)&local_60);
    }
    local_40 = SUB84((anonymous_namespace)::current_class,0);
    uStack_3c = (undefined4)((ulong)(anonymous_namespace)::current_class >> 0x20);
    _Stack_38._M_pi._0_4_ = (undefined4)DAT_00119300;
    _Stack_38._M_pi._4_4_ = (undefined4)((ulong)DAT_00119300 >> 0x20);
    if (DAT_00119300 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(DAT_00119300 + 8) = *(int *)(DAT_00119300 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(DAT_00119300 + 8) = *(int *)(DAT_00119300 + 8) + 1;
      }
    }
    lVar3 = (long)(anonymous_namespace)::current_class;
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (char16_t *)operator_new(0x70);
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.d.ptr)->_M_use_count = 1;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.d.ptr)->_M_weak_count = 1;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.d.ptr)->_vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_00118c38;
    local_58.d.d = (Data *)((long)local_58.d.ptr + 0x10);
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_58.d.ptr + 0x50))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_58.d.ptr + 0x50))->_M_use_count =
         0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_58.d.ptr + 0x50))->_M_weak_count =
         0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_58.d.ptr + 0x60))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_58.d.ptr + 0x60))->_M_use_count =
         0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_58.d.ptr + 0x60))->_M_weak_count =
         0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_58.d.ptr + 0x10))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_58.d.ptr + 0x10))->_M_use_count =
         0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_58.d.ptr + 0x10))->_M_weak_count =
         0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_58.d.ptr + 0x20))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_58.d.ptr + 0x20))->_M_use_count =
         0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_58.d.ptr + 0x20))->_M_weak_count =
         0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_58.d.ptr + 0x30))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_58.d.ptr + 0x30))->_M_use_count =
         0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_58.d.ptr + 0x30))->_M_weak_count =
         0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_58.d.ptr + 0x40))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_58.d.ptr + 0x40))->_M_use_count =
         0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_58.d.ptr + 0x40))->_M_weak_count =
         0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_58.d.ptr + 0x50))->
    _vptr__Sp_counted_base = (_func_int **)((long)local_58.d.ptr + 0x60);
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_58.d.ptr + 0x50))->_M_use_count =
         0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_58.d.ptr + 0x50))->_M_weak_count =
         0;
    *(undefined1 *)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_58.d.ptr + 0x60))->
      _vptr__Sp_counted_base = 0;
    std::vector<std::shared_ptr<MetaClass>,std::allocator<std::shared_ptr<MetaClass>>>::
    emplace_back<std::shared_ptr<MetaClass>>
              ((vector<std::shared_ptr<MetaClass>,std::allocator<std::shared_ptr<MetaClass>>> *)
               (lVar3 + 0x18),(shared_ptr<MetaClass> *)&local_58);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.d.ptr !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.d.ptr);
    }
    plVar1 = (long *)((long)(anonymous_namespace)::current_class + 0x20);
    (anonymous_namespace)::current_class = *(element_type **)(*plVar1 + -0x10);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&DAT_00119300,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(*plVar1 + -8));
    peVar4 = (anonymous_namespace)::current_class;
    ((anonymous_namespace)::current_class->parent).
    super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)CONCAT44(uStack_3c,local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(peVar4->parent).super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&_Stack_38);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        CONCAT44(_Stack_38._M_pi._4_4_,_Stack_38._M_pi._0_4_) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT44(_Stack_38._M_pi._4_4_,_Stack_38._M_pi._0_4_));
    }
  }
  std::__cxx11::string::_M_assign((string *)&(anonymous_namespace)::current_class->name);
  parser();
  if ((parser()::category[0x10] & 1) != 0) {
    parser();
    local_40 = 2;
    uStack_3c = 0;
    _Stack_38._M_pi._0_4_ = 0;
    _Stack_38._M_pi._4_4_ = 0;
    uStack_30 = 0;
    local_2c = 0;
    local_28 = parser()::category._8_8_;
    QMessageLogger::debug();
    pQVar2 = local_60;
    QVar9.m_data = (storage_type *)0xd;
    QVar9.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar9);
    QTextStream::operator<<(pQVar2,&local_58);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.d.d !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,8);
      }
    }
    if (local_60[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(local_60,' ');
    }
    debug = operator<<((QDebug *)&local_60,&(anonymous_namespace)::current_class->name);
    pQVar2 = *(QTextStream **)debug;
    QVar10.m_data = (storage_type *)0xa;
    QVar10.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar10);
    QTextStream::operator<<(pQVar2,&local_58);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.d.d !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,8);
      }
    }
    if ((*(QTextStream **)debug)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)debug,' ');
    }
    operator<<(debug,(string *)(anonymous_namespace)::array_value_abi_cxx11_);
    QDebug::~QDebug((QDebug *)&local_60);
  }
  DAT_00119310 = 0;
  *(anonymous_namespace)::global_string_abi_cxx11_ = 0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(code **)&(__return_storage_ptr__->super__Function_base)._M_functor = class_state;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_manager;
  return __return_storage_ptr__;
}

Assistant:

callback_t begin_class_state(MetaConfiguration &conf, std::ifstream &f,
                             int &error) {
  qCDebug(parser) << "Starting class: " << global_string;

  f.ignore(); // eat the '{' character.
  clear_empty(f);
  trim(global_string);

  if (!conf.top_level_class) {
    qCDebug(parser) << "Creating the top level class";
    conf.top_level_class = std::make_shared<MetaClass>();
    current_class = conf.top_level_class;
  } else {
    assert(current_class);
    qCDebug(parser) << "Creating a child class of" << current_class->name;
    auto old_parent = current_class;
    current_class->subclasses.push_back(std::make_shared<MetaClass>());
    current_class = current_class->subclasses.back();
    current_class->parent = old_parent;
  }
  current_class->name = global_string;

  qCDebug(parser) << "class found: " << current_class->name
                  << ", value = " << array_value;

  global_string.clear();
  return class_state;
}